

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O0

void __thiscall Assimp::PretransformVertices::PretransformVertices(PretransformVertices *this)

{
  PretransformVertices *this_local;
  
  BaseProcess::BaseProcess(&this->super_BaseProcess);
  (this->super_BaseProcess)._vptr_BaseProcess = (_func_int **)&PTR__PretransformVertices_0037abb0;
  this->configKeepHierarchy = false;
  this->configNormalize = false;
  this->configTransform = false;
  aiMatrix4x4t<float>::aiMatrix4x4t(&this->configTransformation);
  this->mConfigPointCloud = false;
  return;
}

Assistant:

PretransformVertices::PretransformVertices()
: configKeepHierarchy (false)
, configNormalize(false)
, configTransform(false)
, configTransformation()
, mConfigPointCloud( false ) {
    // empty
}